

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O3

int cpu_request_core_type(cpu_purpose_t purpose,cpu_raw_data_array_t *raw_array,cpu_id_t *data)

{
  int iVar1;
  cpu_purpose_t cVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  logical_cpu_t *plVar6;
  cpu_raw_data_t **ppcVar7;
  cpu_raw_data_array_t my_raw_array;
  internal_id_info_t throwaway;
  cpu_raw_data_array_t local_68;
  internal_id_info_t local_58;
  
  if (raw_array == (cpu_raw_data_array_t *)0x0) {
    iVar1 = cpuid_get_all_raw_data(&local_68);
    if (iVar1 < 0) {
      return iVar1;
    }
    ppcVar7 = &local_68.raw;
    plVar6 = &local_68.num_raw;
  }
  else {
    plVar6 = &raw_array->num_raw;
    ppcVar7 = &raw_array->raw;
  }
  iVar1 = -0x11;
  if (*plVar6 != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      cVar2 = cpu_ident_purpose((cpu_raw_data_t *)((long)(*ppcVar7)->basic_cpuid[0] + lVar5));
      if (cVar2 == purpose) {
        cpu_ident_internal((cpu_raw_data_t *)((long)(*ppcVar7)->basic_cpuid[0] + lVar5),data,
                           &local_58);
        iVar1 = 0;
        break;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x6b0;
    } while (uVar4 < *plVar6);
  }
  piVar3 = (int *)__tls_get_addr(&PTR_00134f60);
  *piVar3 = iVar1;
  return iVar1;
}

Assistant:

int cpu_request_core_type(cpu_purpose_t purpose, struct cpu_raw_data_array_t* raw_array, struct cpu_id_t* data)
{
	int r;
	logical_cpu_t logical_cpu = 0;
	struct cpu_raw_data_array_t my_raw_array;
	struct internal_id_info_t throwaway;

	if (!raw_array) {
		if ((r = cpuid_get_all_raw_data(&my_raw_array)) < 0)
			return r;
		raw_array = &my_raw_array;
	}

	for (logical_cpu = 0; logical_cpu < raw_array->num_raw; logical_cpu++) {
		if (cpu_ident_purpose(&raw_array->raw[logical_cpu]) == purpose) {
			cpu_ident_internal(&raw_array->raw[logical_cpu], data, &throwaway);
			return cpuid_set_error(ERR_OK);
		}
	}

	return cpuid_set_error(ERR_NOT_FOUND);
}